

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

QAction * __thiscall QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon)

{
  QAction *this_00;
  QArrayDataPointer<char16_t> local_38;
  
  this_00 = (QAction *)operator_new(0x10);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QAction::QAction(this_00,icon,(QString *)&local_38,(QObject *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QWidget::addAction((QAction *)this);
  return this_00;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon )
{
	QAction * action = new QAction( icon, QString(), this );
	addAction( action );
	return action;
}